

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XmlRpcValue.cpp
# Opt level: O1

bool __thiscall XmlRpc::XmlRpcValue::binaryFromXml(XmlRpcValue *this,string *valueXml,int *offset)

{
  int iVar1;
  long lVar2;
  tm *this_00;
  size_type __n;
  int length_in;
  long lVar3;
  Decoder decoder;
  allocator_type local_4a;
  value_type local_49;
  string *local_48;
  Decoder local_3c;
  
  lVar2 = std::__cxx11::string::find((char)valueXml,0x3c);
  if (lVar2 != -1) {
    iVar1 = *offset;
    lVar3 = lVar2 - iVar1;
    this->_type = TypeBase64;
    __n = 1;
    if (lVar3 != 0) {
      __n = ((lVar2 - iVar1) + 3U >> 2) * 3;
    }
    local_48 = valueXml;
    this_00 = (tm *)operator_new(0x18);
    local_49 = '\0';
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)this_00,__n,&local_49,&local_4a);
    (this->_value).asTime = this_00;
    base64::Decoder::Decoder(&local_3c,0x200);
    length_in = (int)lVar3;
    iVar1 = base64::Decoder::decode
                      (&local_3c,(local_48->_M_dataplus)._M_p + *offset,length_in,
                       (((this->_value).asBinary)->super__Vector_base<char,_std::allocator<char>_>).
                       _M_impl.super__Vector_impl_data._M_start);
    std::vector<char,_std::allocator<char>_>::resize
              ((vector<char,_std::allocator<char>_> *)(this->_value).asTime,(long)iVar1);
    *offset = *offset + length_in;
  }
  return lVar2 != -1;
}

Assistant:

bool XmlRpcValue::binaryFromXml(std::string const& valueXml, int* offset)
  {
    size_t valueEnd = valueXml.find('<', *offset);
    if (valueEnd == std::string::npos)
      return false;     // No end tag;

    std::size_t encoded_size = valueEnd - *offset;


    _type = TypeBase64;
    // might reserve too much, we'll shrink later
    _value.asBinary = new BinaryData(base64DecodedSize(encoded_size), '\0');

    base64::Decoder decoder;
    std::size_t size = decoder.decode(&valueXml[*offset], encoded_size, &(*_value.asBinary)[0]);
    _value.asBinary->resize(size);

    *offset += encoded_size;
    return true;
  }